

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcComplexProperty::~IfcComplexProperty(IfcComplexProperty *this)

{
  _func_int *p_Var1;
  _func_int *p_Var2;
  void *pvVar3;
  
  p_Var2 = (this->super_IfcProperty).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>.
           _vptr_ObjectHelper[-3];
  p_Var1 = (_func_int *)
           ((long)&(this->super_IfcProperty).
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>._vptr_ObjectHelper
           + (long)p_Var2);
  *(undefined8 *)
   ((long)&(this->super_IfcProperty).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>.
           _vptr_ObjectHelper + (long)p_Var2) = 0x89b6e8;
  *(undefined8 *)(&this->field_0xa0 + (long)p_Var2) = 0x89b738;
  *(undefined8 *)(&(this->super_IfcProperty).field_0x58 + (long)p_Var2) = 0x89b710;
  pvVar3 = *(void **)(p_Var2 + (long)&(this->HasProperties).
                                      super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>_>_>
                                      .
                                      super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>_>_>
                                      ._M_impl);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,*(long *)(p_Var1 + 0x98) - (long)pvVar3);
  }
  if (*(code **)(p_Var1 + 0x68) != p_Var1 + 0x78) {
    operator_delete(*(code **)(p_Var1 + 0x68),*(long *)(p_Var1 + 0x78) + 1);
  }
  *(undefined8 *)p_Var1 = 0x89b760;
  *(undefined8 *)(p_Var1 + 0xa0) = 0x89b788;
  if (*(code **)(p_Var1 + 0x30) != p_Var1 + 0x40) {
    operator_delete(*(code **)(p_Var1 + 0x30),*(long *)(p_Var1 + 0x40) + 1);
  }
  if (*(code **)(p_Var1 + 0x10) != p_Var1 + 0x20) {
    operator_delete(*(code **)(p_Var1 + 0x10),*(long *)(p_Var1 + 0x20) + 1);
    return;
  }
  return;
}

Assistant:

IfcComplexProperty() : Object("IfcComplexProperty") {}